

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_data.c
# Opt level: O0

void release_unicode_data(unicode_data_t *ud)

{
  ulong local_18;
  size_t i;
  unicode_data_t *ud_local;
  
  for (local_18 = 0; local_18 < ud->size; local_18 = local_18 + 1) {
    free(ud->records[local_18].name);
    free(ud->records[local_18].decomposition);
    free(ud->records[local_18].numeric_value);
  }
  free(ud->records);
  free(ud);
  return;
}

Assistant:

void release_unicode_data( struct unicode_data_t * ud )
{
    size_t i;

    for ( i = 0; i < ud->size; ++i )
    {
        free( ud->records[i].name );
        free( ud->records[i].decomposition );
        free( ud->records[i].numeric_value );
    }

    free( ud->records );
    free( ud );
}